

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Maybe<capnp::compiler::Compiler::CompiledType> * __thiscall
capnp::compiler::Compiler::CompiledType::getMember
          (Maybe<capnp::compiler::Compiler::CompiledType> *__return_storage_ptr__,CompiledType *this
          ,StringPtr name)

{
  Compiler *pCVar1;
  Reader subSource;
  undefined1 auVar2 [40];
  bool bVar3;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> *pEVar4;
  BrandScope *pBVar5;
  Mutex *pMVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  Locked<const_kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> lock;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> newDecl;
  undefined1 local_338 [16];
  anon_union_96_1_a8a2e026_for_OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_2
  aStack_328;
  BrandScope *pBStack_2c8;
  BrandScope *local_2c0;
  SegmentReader *pSStack_2b8;
  CapTableReader *local_2b0;
  WirePointer *pWStack_2a8;
  WirePointer *local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *local_288;
  Own<capnp::compiler::Compiler::Impl,_std::nullptr_t> *local_280;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_278;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_1c8;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  Maybe<capnp::compiler::BrandedDecl> local_e0;
  MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> *this_00;
  
  local_278.mutex = (Mutex *)0x0;
  local_278.value.body.tag = 0;
  local_278.value.brand.disposer = (Disposer *)0x0;
  local_278.value.brand.ptr = (BrandScope *)0x0;
  local_278.value.source._reader.segment = (SegmentReader *)0x0;
  local_278.value.source._reader.capTable = (CapTableReader *)0x0;
  local_278.value.source._reader.data = (WirePointer *)0x0;
  local_278.value.source._reader.pointers._0_6_ = 0;
  local_278.value.source._reader.pointers._6_2_ = 0;
  local_278.value.source._reader.dataSize = 0;
  local_278.value.source._reader.pointerCount = 0;
  local_278.value.source._reader.nestingLimit = 0x7fffffff;
  pCVar1 = this->compiler;
  this_00 = &pCVar1->impl;
  kj::_::Mutex::lock(&this_00->mutex,1);
  local_280 = &(pCVar1->impl).value;
  local_f8 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_108 = 0;
  uStack_100 = 0;
  uStack_f0 = 0x7fffffff;
  auVar2 = ZEXT1640(ZEXT816(0));
  subSource._reader._40_8_ = 0x7fffffff;
  subSource._reader.segment = (SegmentReader *)auVar2._0_8_;
  subSource._reader.capTable = (CapTableReader *)auVar2._8_8_;
  subSource._reader.data = (void *)auVar2._16_8_;
  subSource._reader.pointers = (WirePointer *)auVar2._24_8_;
  subSource._reader.dataSize = auVar2._32_4_;
  subSource._reader.pointerCount = auVar2._36_2_;
  subSource._reader._38_2_ = auVar2._38_2_;
  local_288 = this_00;
  BrandedDecl::getMember(&local_e0,&(this->decl).value,name,subSource);
  if (local_e0.ptr.isSet == true) {
    local_338._0_4_ = local_e0.ptr.field_1.value.body.tag;
    if (local_e0.ptr.field_1.value.body.tag == 2) {
      local_338._8_8_ = local_e0.ptr.field_1._8_8_;
      aStack_328._0_8_ = local_e0.ptr.field_1._16_8_;
    }
    else if (local_e0.ptr.field_1.value.body.tag == 1) {
      aStack_328._24_8_ = local_e0.ptr.field_1._40_8_;
      aStack_328._8_8_ = local_e0.ptr.field_1._24_8_;
      aStack_328._16_8_ = local_e0.ptr.field_1._32_8_;
      local_338._8_8_ = local_e0.ptr.field_1._8_8_;
      aStack_328._0_8_ = local_e0.ptr.field_1._16_8_;
      aStack_328.space[0x20] = local_e0.ptr.field_1._48_1_;
      if (local_e0.ptr.field_1._48_1_ == '\x01') {
        aStack_328._72_8_ = local_e0.ptr.field_1._88_8_;
        aStack_328._80_8_ = local_e0.ptr.field_1._96_8_;
        aStack_328._56_8_ = local_e0.ptr.field_1._72_8_;
        aStack_328._64_8_ = local_e0.ptr.field_1._80_8_;
        aStack_328._40_8_ = local_e0.ptr.field_1._56_8_;
        aStack_328._48_8_ = local_e0.ptr.field_1._64_8_;
        local_e0.ptr.field_1._48_1_ = '\0';
      }
    }
    aStack_328._88_8_ = local_e0.ptr.field_1.value.brand.disposer;
    pBStack_2c8 = local_e0.ptr.field_1.value.brand.ptr;
    local_2c0 = (BrandScope *)local_e0.ptr.field_1.value.source._reader.segment;
    pSStack_2b8 = (SegmentReader *)local_e0.ptr.field_1.value.source._reader.capTable;
    local_2b0 = (CapTableReader *)local_e0.ptr.field_1.value.source._reader.data;
    pWStack_2a8 = local_e0.ptr.field_1.value.source._reader.pointers;
    local_2a0 = (WirePointer *)local_e0.ptr.field_1._152_8_;
    uStack_298._0_4_ = local_e0.ptr.field_1.value.source._reader.nestingLimit;
    uStack_298._4_2_ = local_e0.ptr.field_1._164_2_;
    uStack_298._6_2_ = local_e0.ptr.field_1._166_2_;
    local_278.mutex = &this_00->mutex;
    BrandedDecl::operator=(&local_278.value,(BrandedDecl *)local_338);
  }
  pBVar5 = pBStack_2c8;
  if ((local_e0.ptr.isSet & 1U) != 0) {
    if (pBStack_2c8 != (BrandScope *)0x0) {
      pBStack_2c8 = (BrandScope *)0x0;
      (***(_func_int ***)aStack_328._88_8_)
                (aStack_328._88_8_,
                 (_func_int *)
                 ((long)&(pBVar5->super_Refcounted).super_Disposer._vptr_Disposer +
                 (long)(pBVar5->super_Refcounted).super_Disposer._vptr_Disposer[-2]));
    }
    if (local_338._0_4_ - 1 < 2) {
      local_338._0_8_ = local_338._0_8_ & 0xffffffff00000000;
    }
  }
  kj::_::Mutex::unlock(&this_00->mutex,SHARED,(Waiter *)0x0);
  pBVar5 = local_278.value.brand.ptr;
  uVar7 = local_278.value.body.field_1.space[0x28];
  pMVar6 = local_278.mutex;
  uVar8 = SUB81(this_00,0);
  if (local_e0.ptr.isSet == false) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    pCVar1 = this->compiler;
    local_1c8.value.body.tag = local_278.value.body.tag;
    if (local_278.value.body.tag == 1) {
      local_1c8.value.body.field_1._32_8_ = local_278.value.body.field_1._32_8_;
      local_1c8.value.body.field_1._16_8_ = local_278.value.body.field_1._16_8_;
      local_1c8.value.body.field_1._24_8_ = local_278.value.body.field_1._24_8_;
      local_1c8.value.body.field_1._0_8_ = local_278.value.body.field_1._0_8_;
      local_1c8.value.body.field_1._8_8_ = local_278.value.body.field_1._8_8_;
      local_1c8.value.body.field_1.space[0x28] = local_278.value.body.field_1.space[0x28];
      if (local_278.value.body.field_1.space[0x28] == 1) {
        local_1c8.value.body.field_1._80_8_ = local_278.value.body.field_1._80_8_;
        local_1c8.value.body.field_1._88_8_ = local_278.value.body.field_1._88_8_;
        local_1c8.value.body.field_1._64_8_ = local_278.value.body.field_1._64_8_;
        local_1c8.value.body.field_1._72_8_ = local_278.value.body.field_1._72_8_;
        local_1c8.value.body.field_1._48_8_ = local_278.value.body.field_1._48_8_;
        local_1c8.value.body.field_1._56_8_ = local_278.value.body.field_1._56_8_;
        local_278.value.body.field_1.space[0x28] = 0;
      }
      bVar3 = false;
      uVar8 = uVar7;
    }
    else if (local_278.value.body.tag == 2) {
      local_1c8.value.body.field_1._0_8_ = local_278.value.body.field_1._0_8_;
      local_1c8.value.body.field_1._8_8_ = local_278.value.body.field_1._8_8_;
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    local_1c8.value.brand.disposer = local_278.value.brand.disposer;
    local_278.value.brand.ptr = (BrandScope *)0x0;
    local_1c8.value.source._reader.segment = local_278.value.source._reader.segment;
    local_1c8.value.source._reader.capTable = local_278.value.source._reader.capTable;
    local_1c8.value.source._reader.pointers =
         (WirePointer *)
         CONCAT26(local_278.value.source._reader.pointers._6_2_,
                  local_278.value.source._reader.pointers._0_6_);
    local_1c8.value.source._reader.data = local_278.value.source._reader.data;
    local_1c8.value.source._reader._38_2_ = local_278.value.source._reader._38_2_;
    local_1c8.value.source._reader.dataSize = local_278.value.source._reader.dataSize;
    local_1c8.value.source._reader.pointerCount = local_278.value.source._reader.pointerCount;
    local_1c8.value.source._reader._44_4_ = local_278.value.source._reader._44_4_;
    local_1c8.value.source._reader.nestingLimit = local_278.value.source._reader.nestingLimit;
    local_278.mutex = (Mutex *)0x0;
    local_338._8_4_ = local_278.value.body.tag;
    if (local_278.value.body.tag == 1) {
      aStack_328._32_8_ = local_1c8.value.body.field_1._32_8_;
      aStack_328._16_8_ = local_1c8.value.body.field_1._16_8_;
      aStack_328._24_8_ = local_1c8.value.body.field_1._24_8_;
      aStack_328._0_8_ = local_1c8.value.body.field_1._0_8_;
      aStack_328._8_8_ = local_1c8.value.body.field_1._8_8_;
      aStack_328.space[0x28] = uVar8;
      if ((uVar8 & 1) != 0) {
        aStack_328._80_8_ = local_1c8.value.body.field_1._80_8_;
        aStack_328._88_8_ = local_1c8.value.body.field_1._88_8_;
        aStack_328._64_8_ = local_1c8.value.body.field_1._64_8_;
        aStack_328._72_8_ = local_1c8.value.body.field_1._72_8_;
        aStack_328._48_8_ = local_1c8.value.body.field_1._48_8_;
        aStack_328._56_8_ = local_1c8.value.body.field_1._56_8_;
        local_1c8.value.body.field_1.space[0x28] = 0;
      }
    }
    if (bVar3) {
      aStack_328._0_8_ = local_1c8.value.body.field_1._0_8_;
      aStack_328._8_8_ = local_1c8.value.body.field_1._8_8_;
    }
    pBStack_2c8 = (BrandScope *)local_278.value.brand.disposer;
    local_1c8.value.brand.ptr = (BrandScope *)0x0;
    local_2a0 = (WirePointer *)
                CONCAT26(local_278.value.source._reader.pointers._6_2_,
                         local_278.value.source._reader.pointers._0_6_);
    uStack_298._6_2_ = local_278.value.source._reader._38_2_;
    uStack_298._0_4_ = local_278.value.source._reader.dataSize;
    uStack_298._4_2_ = local_278.value.source._reader.pointerCount;
    uStack_290._4_4_ = local_278.value.source._reader._44_4_;
    uStack_290._0_4_ = local_278.value.source._reader.nestingLimit;
    pSStack_2b8 = local_278.value.source._reader.segment;
    local_2b0 = local_278.value.source._reader.capTable;
    pWStack_2a8 = (WirePointer *)local_278.value.source._reader.data;
    local_1c8.mutex = (Mutex *)0x0;
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.compiler = pCVar1;
    (__return_storage_ptr__->ptr).field_1.value.decl.mutex = pMVar6;
    *(uint *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = local_278.value.body.tag;
    if (local_278.value.body.tag == 1) {
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x20) =
           aStack_328._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x10) =
           aStack_328._16_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x18) =
           aStack_328._24_8_;
      *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 =
           aStack_328._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 8) =
           aStack_328._8_8_;
      *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = uVar8;
      if ((uVar8 & 1) != 0) {
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x50) =
             aStack_328._80_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x58) =
             aStack_328._88_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x40) =
             aStack_328._64_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x48) =
             aStack_328._72_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x30) =
             aStack_328._48_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 0x38) =
             aStack_328._56_8_;
        aStack_328._40_8_ = aStack_328._40_8_ & 0xffffffffffffff00;
      }
    }
    if (bVar3) {
      *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 =
           aStack_328._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->ptr).field_1.value.decl.value.body.field_1 + 8) =
           aStack_328._8_8_;
    }
    (__return_storage_ptr__->ptr).field_1.value.decl.value.brand.disposer =
         local_278.value.brand.disposer;
    (__return_storage_ptr__->ptr).field_1.value.decl.value.brand.ptr = pBVar5;
    local_2c0 = (BrandScope *)0x0;
    pEVar4 = &(__return_storage_ptr__->ptr).field_1.value.decl;
    (pEVar4->value).source._reader.dataSize = local_278.value.source._reader.dataSize;
    (pEVar4->value).source._reader.pointerCount = local_278.value.source._reader.pointerCount;
    *(undefined2 *)&(pEVar4->value).source._reader.field_0x26 =
         local_278.value.source._reader._38_2_;
    *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.nestingLimit =
         CONCAT44(local_278.value.source._reader._44_4_,local_278.value.source._reader.nestingLimit)
    ;
    (__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.data =
         local_278.value.source._reader.data;
    (__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.pointers =
         (WirePointer *)
         CONCAT26(local_278.value.source._reader.pointers._6_2_,
                  local_278.value.source._reader.pointers._0_6_);
    (__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.segment =
         local_278.value.source._reader.segment;
    (__return_storage_ptr__->ptr).field_1.value.decl.value.source._reader.capTable =
         local_278.value.source._reader.capTable;
    local_338._0_8_ = (Mutex *)0x0;
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded
              ((ExternalMutexGuarded<capnp::compiler::BrandedDecl> *)local_338);
    kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_1c8);
  }
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_278);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Compiler::CompiledType> Compiler::CompiledType::getMember(kj::StringPtr name) {
  kj::ExternalMutexGuarded<BrandedDecl> newDecl;
  bool found = false;

  {
    auto lock = compiler.impl.lockShared();
    KJ_IF_SOME(member, decl.get(lock).getMember(name, {})) {
      newDecl.set(lock, kj::mv(member));
      found = true;
    }
  }

  if (found) {
    return CompiledType(compiler, kj::mv(newDecl));
  } else {
    return kj::none;
  }
}